

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_comparison_operations(Context *ctx,char *cmp)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint writemask;
  char *in_R8;
  char *buf;
  ulong uVar4;
  uint writemask_00;
  int used_swiz [4];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char code [128];
  
  uVar1 = (ctx->dest_arg).writemask;
  used_swiz[0] = 0;
  used_swiz[1] = 0;
  used_swiz[2] = 0;
  used_swiz[3] = 0;
  local_188._0_4_ = (ctx->dest_arg).writemask0;
  local_188._4_4_ = (ctx->dest_arg).writemask1;
  uStack_180._0_4_ = (ctx->dest_arg).writemask2;
  uStack_180._4_4_ = (ctx->dest_arg).writemask3;
  local_198._0_4_ = ctx->source_args[0].swizzle_x;
  local_198._4_4_ = ctx->source_args[0].swizzle_y;
  uStack_190._0_4_ = ctx->source_args[0].swizzle_z;
  uStack_190._4_4_ = ctx->source_args[0].swizzle_w;
  uVar4 = 0;
  do {
    uVar2 = 2;
    if (2 < uVar4) {
      uVar2 = uVar4;
    }
    writemask = 1 << ((byte)uVar4 & 0x1f);
    buf = in_R8;
    if ((*(int *)((long)&local_188 + uVar4 * 4) != 0) && (used_swiz[uVar4] == 0)) {
      used_swiz[uVar4] = 1;
      writemask_00 = writemask;
      if (uVar4 != 3) {
        uVar3 = uVar4;
        do {
          if ((*(int *)((long)&local_188 + uVar3 * 4 + 4) != 0) &&
             (*(int *)((long)&local_198 + uVar4 * 4) == *(int *)((long)&local_198 + uVar3 * 4 + 4)))
          {
            writemask_00 = writemask_00 | 2 << ((byte)uVar3 & 0x1f);
            used_swiz[uVar3 + 1] = 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar2 + 1 != uVar3);
      }
      buf = src0;
      make_GLSL_srcarg_string(ctx,0,writemask,buf,(size_t)in_R8);
      make_GLSL_srcarg_string(ctx,1,writemask_00,src1,(size_t)in_R8);
      make_GLSL_srcarg_string(ctx,2,writemask_00,src2,(size_t)in_R8);
      (ctx->dest_arg).writemask = writemask_00;
      (ctx->dest_arg).writemask0 = writemask_00 & 1;
      (ctx->dest_arg).writemask1 = writemask_00 >> 1 & 1;
      (ctx->dest_arg).writemask2 = writemask_00 >> 2 & 1;
      (ctx->dest_arg).writemask3 = writemask_00 >> 3 & 1;
      make_GLSL_destarg_assign(ctx,code,0x80,"((%s %s) ? %s : %s)",buf,cmp,src1,src2);
      output_line(ctx,"%s",code);
    }
    uVar4 = uVar4 + 1;
    in_R8 = buf;
  } while (uVar4 != 4);
  (ctx->dest_arg).writemask = uVar1;
  (ctx->dest_arg).writemask0 = uVar1 & 1;
  (ctx->dest_arg).writemask1 = uVar1 >> 1 & 1;
  (ctx->dest_arg).writemask2 = uVar1 >> 2 & 1;
  (ctx->dest_arg).writemask3 = uVar1 >> 3 & 1;
  return;
}

Assistant:

static void emit_GLSL_comparison_operations(Context *ctx, const char *cmp)
{
    int i, j;
    DestArgInfo *dst = &ctx->dest_arg;
    const SourceArgInfo *srcarg0 = &ctx->source_args[0];
    const int origmask = dst->writemask;
    int used_swiz[4] = { 0, 0, 0, 0 };
    const int writemask[4] = { dst->writemask0, dst->writemask1,
                               dst->writemask2, dst->writemask3 };
    const int src0swiz[4] = { srcarg0->swizzle_x, srcarg0->swizzle_y,
                              srcarg0->swizzle_z, srcarg0->swizzle_w };

    for (i = 0; i < 4; i++)
    {
        int mask = (1 << i);

        if (!writemask[i]) continue;
        if (used_swiz[i]) continue;

        // This is a swizzle we haven't checked yet.
        used_swiz[i] = 1;

        // see if there are any other elements swizzled to match (.yyyy)
        for (j = i + 1; j < 4; j++)
        {
            if (!writemask[j]) continue;
            if (src0swiz[i] != src0swiz[j]) continue;
            mask |= (1 << j);
            used_swiz[j] = 1;
        } // for

        // okay, (mask) should be the writemask of swizzles we like.

        //return make_GLSL_srcarg_string(ctx, idx, (1 << 0));

        char src0[64];
        char src1[64];
        char src2[64];
        make_GLSL_srcarg_string(ctx, 0, (1 << i), src0, sizeof (src0));
        make_GLSL_srcarg_string(ctx, 1, mask, src1, sizeof (src1));
        make_GLSL_srcarg_string(ctx, 2, mask, src2, sizeof (src2));

        set_dstarg_writemask(dst, mask);

        char code[128];
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "((%s %s) ? %s : %s)",
                                 src0, cmp, src1, src2);
        output_line(ctx, "%s", code);
    } // for

    set_dstarg_writemask(dst, origmask);
}